

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

bool __thiscall
QHttpSocketEngine::waitForRead(QHttpSocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  QDeadlineTimer deadline_00;
  SocketState SVar2;
  undefined4 uVar3;
  SocketError SVar4;
  SocketError SVar5;
  QHttpSocketEnginePrivate *pQVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *in_RCX;
  QAbstractSocketEngine *in_RDI;
  long in_FS_OFFSET;
  QHttpSocketEnginePrivate *d;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QTcpSocket *in_stack_ffffffffffffff78;
  bool local_59;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QHttpSocketEngine *)0x33a4b5);
  if ((pQVar6->socket == (QTcpSocket *)0x0) ||
     (SVar2 = QAbstractSocket::state((QAbstractSocket *)0x33a4da), SVar2 == UnconnectedState)) {
    local_59 = false;
  }
  else {
    lVar7 = (**(code **)(*(long *)&pQVar6->socket->super_QAbstractSocket + 0xa0))();
    if (lVar7 == 0) {
      in_stack_ffffffffffffff78 = pQVar6->socket;
      uVar3 = QDeadlineTimer::remainingTime();
      uVar8 = (**(code **)(*(long *)&in_stack_ffffffffffffff78->super_QAbstractSocket + 0xb8))
                        (in_stack_ffffffffffffff78,uVar3);
      if ((uVar8 & 1) == 0) {
        SVar2 = QAbstractSocket::state((QAbstractSocket *)0x33a54f);
        SVar5 = (SocketError)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (SVar2 == UnconnectedState) {
          local_59 = true;
        }
        else {
          SVar4 = QAbstractSocket::error((QAbstractSocket *)0x33a56f);
          QIODevice::errorString();
          QAbstractSocketEngine::setError
                    (in_RDI,SVar5,(QString *)CONCAT44(SVar4,in_stack_ffffffffffffff70));
          QString::~QString((QString *)0x33a5a6);
          if ((in_RCX != (undefined1 *)0x0) &&
             (SVar5 = QAbstractSocket::error((QAbstractSocket *)0x33a5bf),
             SVar5 == SocketTimeoutError)) {
            *in_RCX = 1;
          }
          local_59 = false;
        }
        goto LAB_0033a68e;
      }
    }
    deadline_00._8_8_ = pQVar6;
    deadline_00.t1 = (qint64)in_RDI;
    waitForProtocolHandshake((QHttpSocketEngine *)in_stack_ffffffffffffff78,deadline_00);
    SVar5 = (SocketError)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (pQVar6->state == Connected) {
      local_59 = true;
    }
    else {
      SVar4 = QAbstractSocket::error((QAbstractSocket *)0x33a625);
      QIODevice::errorString();
      QAbstractSocketEngine::setError
                (in_RDI,SVar5,(QString *)CONCAT44(in_stack_ffffffffffffff74,SVar4));
      QString::~QString((QString *)0x33a65c);
      if ((in_RCX != (undefined1 *)0x0) &&
         (SVar5 = QAbstractSocket::error((QAbstractSocket *)0x33a675), SVar5 == SocketTimeoutError))
      {
        *in_RCX = 1;
      }
      local_59 = false;
    }
  }
LAB_0033a68e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool QHttpSocketEngine::waitForRead(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(const QHttpSocketEngine);

    if (!d->socket || d->socket->state() == QAbstractSocket::UnconnectedState)
        return false;

    // Wait for more data if nothing is available.
    if (!d->socket->bytesAvailable()) {
        if (!d->socket->waitForReadyRead(deadline.remainingTime())) {
            if (d->socket->state() == QAbstractSocket::UnconnectedState)
                return true;
            setError(d->socket->error(), d->socket->errorString());
            if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
                *timedOut = true;
            return false;
        }
    }

    waitForProtocolHandshake(deadline);

    // Report any error that may occur.
    if (d->state != Connected) {
        setError(d->socket->error(), d->socket->errorString());
        if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
            *timedOut = true;
        return false;
    }
    return true;
}